

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryInputWindow.cpp
# Opt level: O3

void __thiscall QueryInputWindow::~QueryInputWindow(QueryInputWindow *this)

{
  ~QueryInputWindow(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

QueryInputWindow::~QueryInputWindow()
{

}